

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O0

int __thiscall deqp::egl::QuerySurfaceTests::init(QuerySurfaceTests *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppNVar1;
  EglTestContext *pEVar2;
  bool bVar3;
  int extraout_EAX;
  TestNode *pTVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  pointer pNVar7;
  char *pcVar8;
  char *pcVar9;
  reference pNVar10;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_208;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_200;
  iterator i_5;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists_5;
  FilterList baseFilters_5;
  TestCaseGroup *pbufferGroup_1;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_1b8;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_1b0;
  iterator i_4;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists_4;
  FilterList baseFilters_4;
  TestCaseGroup *pixmapGroup_1;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_168;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_160;
  iterator i_3;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists_3;
  FilterList baseFilters_3;
  TestCaseGroup *windowGroup_1;
  TestCaseGroup *setAttributeGroup;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_110;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_108;
  iterator i_2;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists_2;
  FilterList baseFilters_2;
  TestCaseGroup *pbufferGroup;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_c0;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_b8;
  iterator i_1;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists_1;
  FilterList baseFilters_1;
  TestCaseGroup *pixmapGroup;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_70;
  __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
  local_68;
  iterator i;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists;
  FilterList baseFilters;
  TestCaseGroup *windowGroup;
  TestCaseGroup *simpleGroup;
  QuerySurfaceTests *this_local;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"simple",
             "Simple queries");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"window",
             "Window surfaces");
  tcu::TestNode::addChild(pTVar4,pTVar5);
  ppNVar1 = &filterLists.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<4u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i);
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i,
             (FilterList *)
             &filterLists.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_68._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i);
  while( true ) {
    local_70._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i);
    bVar3 = __gnu_cxx::operator!=(&local_68,&local_70);
    if (!bVar3) break;
    pTVar6 = (TestNode *)operator_new(0xb8);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_68);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_68);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_68);
    QuerySurfaceSimpleWindowCase::QuerySurfaceSimpleWindowCase
              ((QuerySurfaceSimpleWindowCase *)pTVar6,pEVar2,pcVar8,pcVar9,
               &pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_68,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i);
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pixmap",
             "Pixmap surfaces");
  tcu::TestNode::addChild(pTVar4,pTVar5);
  ppNVar1 = &filterLists_1.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<2u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_1
            );
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_1
             ,(FilterList *)
              &filterLists_1.
               super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_b8._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i_1);
  while( true ) {
    local_c0._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i_1);
    bVar3 = __gnu_cxx::operator!=(&local_b8,&local_c0);
    if (!bVar3) break;
    pTVar6 = (TestNode *)operator_new(0xb8);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_b8);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_b8);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_b8);
    QuerySurfaceSimplePixmapCase::QuerySurfaceSimplePixmapCase
              ((QuerySurfaceSimplePixmapCase *)pTVar6,pEVar2,pcVar8,pcVar9,
               &pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_b8,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_1
            );
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists_1.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pbuffer",
             "Pbuffer surfaces");
  tcu::TestNode::addChild(pTVar4,pTVar5);
  ppNVar1 = &filterLists_2.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<1u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_2
            );
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_2
             ,(FilterList *)
              &filterLists_2.
               super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_108._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i_2);
  while( true ) {
    local_110._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i_2);
    bVar3 = __gnu_cxx::operator!=(&local_108,&local_110);
    if (!bVar3) break;
    pTVar4 = (TestNode *)operator_new(0xb8);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_108);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_108);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_108);
    QuerySurfaceSimplePbufferCase::QuerySurfaceSimplePbufferCase
              ((QuerySurfaceSimplePbufferCase *)pTVar4,pEVar2,pcVar8,pcVar9,
               &pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar5,pTVar4);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_108,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_2
            );
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists_2.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "set_attribute","Setting attributes");
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"window",
             "Window surfaces");
  tcu::TestNode::addChild(pTVar4,pTVar5);
  ppNVar1 = &filterLists_3.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<4u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_3
            );
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_3
             ,(FilterList *)
              &filterLists_3.
               super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_160._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i_3);
  while( true ) {
    local_168._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i_3);
    bVar3 = __gnu_cxx::operator!=(&local_160,&local_168);
    if (!bVar3) break;
    pTVar6 = (TestNode *)operator_new(0xb8);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_160);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_160);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_160);
    SurfaceAttribWindowCase::SurfaceAttribWindowCase
              ((SurfaceAttribWindowCase *)pTVar6,pEVar2,pcVar8,pcVar9,&pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_160,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_3
            );
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists_3.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pixmap",
             "Pixmap surfaces");
  tcu::TestNode::addChild(pTVar4,pTVar5);
  ppNVar1 = &filterLists_4.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<2u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_4
            );
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_4
             ,(FilterList *)
              &filterLists_4.
               super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1b0._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i_4);
  while( true ) {
    local_1b8._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i_4);
    bVar3 = __gnu_cxx::operator!=(&local_1b0,&local_1b8);
    if (!bVar3) break;
    pTVar6 = (TestNode *)operator_new(0xb8);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_1b0);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_1b0);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_1b0);
    SurfaceAttribPixmapCase::SurfaceAttribPixmapCase
              ((SurfaceAttribPixmapCase *)pTVar6,pEVar2,pcVar8,pcVar9,&pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar5,pTVar6);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_1b0,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_4
            );
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists_4.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pbuffer",
             "Pbuffer surfaces");
  tcu::TestNode::addChild(pTVar4,pTVar5);
  ppNVar1 = &filterLists_5.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  eglu::FilterList::FilterList((FilterList *)ppNVar1);
  eglu::FilterList::operator<<((FilterList *)ppNVar1,surfaceType<1u>);
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_5
            );
  getDefaultFilterLists
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_5
             ,(FilterList *)
              &filterLists_5.
               super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_200._M_current =
       (NamedFilterList *)
       std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::begin
                 ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *
                  )&i_5);
  while( true ) {
    local_208._M_current =
         (NamedFilterList *)
         std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::end
                   ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                     *)&i_5);
    bVar3 = __gnu_cxx::operator!=(&local_200,&local_208);
    if (!bVar3) break;
    pTVar4 = (TestNode *)operator_new(0xb8);
    pEVar2 = (this->super_TestCaseGroup).m_eglTestCtx;
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_200);
    pcVar8 = NamedFilterList::getName(pNVar7);
    pNVar7 = __gnu_cxx::
             __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
             ::operator->(&local_200);
    pcVar9 = NamedFilterList::getDescription(pNVar7);
    pNVar10 = __gnu_cxx::
              __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
              ::operator*(&local_200);
    SurfaceAttribPbufferCase::SurfaceAttribPbufferCase
              ((SurfaceAttribPbufferCase *)pTVar4,pEVar2,pcVar8,pcVar9,&pNVar10->super_FilterList);
    tcu::TestNode::addChild(pTVar5,pTVar4);
    __gnu_cxx::
    __normal_iterator<deqp::egl::NamedFilterList_*,_std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>_>
    ::operator++(&local_200,0);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            ((vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> *)&i_5
            );
  eglu::FilterList::~FilterList
            ((FilterList *)
             &filterLists_5.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return extraout_EAX;
}

Assistant:

void QuerySurfaceTests::init (void)
{
	// Simple queries
	{
		tcu::TestCaseGroup* simpleGroup = new tcu::TestCaseGroup(m_testCtx, "simple", "Simple queries");
		addChild(simpleGroup);

		// Window
		{
			tcu::TestCaseGroup* windowGroup = new tcu::TestCaseGroup(m_testCtx, "window", "Window surfaces");
			simpleGroup->addChild(windowGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_WINDOW_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				windowGroup->addChild(new QuerySurfaceSimpleWindowCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}

		// Pixmap
		{
			tcu::TestCaseGroup* pixmapGroup = new tcu::TestCaseGroup(m_testCtx, "pixmap", "Pixmap surfaces");
			simpleGroup->addChild(pixmapGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_PIXMAP_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				pixmapGroup->addChild(new QuerySurfaceSimplePixmapCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}

		// Pbuffer
		{
			tcu::TestCaseGroup* pbufferGroup = new tcu::TestCaseGroup(m_testCtx, "pbuffer", "Pbuffer surfaces");
			simpleGroup->addChild(pbufferGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_PBUFFER_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				pbufferGroup->addChild(new QuerySurfaceSimplePbufferCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}
	}

	// Set surface attributes
	{
		tcu::TestCaseGroup* setAttributeGroup = new tcu::TestCaseGroup(m_testCtx, "set_attribute", "Setting attributes");
		addChild(setAttributeGroup);

		// Window
		{
			tcu::TestCaseGroup* windowGroup = new tcu::TestCaseGroup(m_testCtx, "window", "Window surfaces");
			setAttributeGroup->addChild(windowGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_WINDOW_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				windowGroup->addChild(new SurfaceAttribWindowCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}

		// Pixmap
		{
			tcu::TestCaseGroup* pixmapGroup = new tcu::TestCaseGroup(m_testCtx, "pixmap", "Pixmap surfaces");
			setAttributeGroup->addChild(pixmapGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_PIXMAP_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				pixmapGroup->addChild(new SurfaceAttribPixmapCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}

		// Pbuffer
		{
			tcu::TestCaseGroup* pbufferGroup = new tcu::TestCaseGroup(m_testCtx, "pbuffer", "Pbuffer surfaces");
			setAttributeGroup->addChild(pbufferGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_PBUFFER_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				pbufferGroup->addChild(new SurfaceAttribPbufferCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}
	}
}